

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  uint *dst_00;
  ushort uVar1;
  ZSTD_longLengthType_e ZVar2;
  ZSTD_compressedBlockState_t *CTable;
  bool bVar3;
  undefined8 uVar4;
  U32 UVar5;
  int iVar6;
  byte *pbVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  byte *pbVar11;
  undefined4 uVar12;
  uint uVar13;
  U32 UVar14;
  FSE_CTable *pFVar15;
  U32 UVar16;
  ulong uVar17;
  size_t __n;
  size_t err_code_3;
  size_t err_code;
  FSE_CTable *sourceSize;
  byte *pbVar18;
  byte *pbVar19;
  long lVar20;
  U32 UVar21;
  U16 *pUVar22;
  U32 UVar23;
  uint uVar24;
  undefined4 in_register_0000008c;
  size_t nbSeq;
  byte bVar25;
  symbolEncodingType_e sVar26;
  FSE_CTable *pFVar27;
  long lVar28;
  U32 *count;
  seqDef *psVar29;
  seqDef *sequences;
  bool bVar30;
  bool bVar31;
  undefined4 in_stack_fffffffffffffd88;
  byte bVar32;
  uint local_268;
  undefined8 local_240;
  U32 local_238;
  U32 *local_230;
  BYTE *local_228;
  FSE_CTable *local_220;
  long local_218;
  size_t local_210;
  uint local_204;
  BYTE *local_200;
  FSE_CTable *local_1f8;
  BYTE *local_1f0;
  ZSTD_CCtx *local_1e8;
  byte *local_1e0;
  FSE_CTable *local_1d8;
  FSE_CTable *local_1d0;
  ZSTD_fseCTables_t *local_1c8;
  ZSTD_compressedBlockState_t *local_1c0;
  byte *local_1b8;
  ulong local_1b0;
  undefined8 local_1a8;
  seqDef *local_1a0;
  byte *local_198;
  seqDef *local_190;
  seqDef *local_188;
  void *local_180;
  BYTE *local_178;
  seqDef *local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_1a8 = CONCAT44(in_register_0000008c,lastBlock);
  pbVar7 = (byte *)ZSTD_buildBlockEntropyStats
                             (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                              &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                              &entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (pbVar7 < (byte *)0xffffffffffffff89) {
    local_1c0 = (zc->blockState).prevCBlock;
    CTable = (zc->blockState).nextCBlock;
    local_1b0 = (ulong)(uint)zc->bmi2;
    count = zc->entropyWorkspace;
    sequences = (zc->seqStore).sequencesStart;
    local_190 = (zc->seqStore).sequences;
    local_228 = (zc->seqStore).litStart;
    local_178 = (zc->seqStore).lit;
    local_1b8 = (byte *)(srcSize + (long)src);
    local_218 = dstCapacity + (long)dst;
    local_1f0 = (zc->seqStore).llCode;
    local_1f8 = (FSE_CTable *)(zc->seqStore).mlCode;
    local_200 = (zc->seqStore).ofCode;
    local_198 = (byte *)(zc->appliedParams).targetCBlockSize;
    local_268 = (uint)(entropyMetadata.hufMetadata.hType == set_compressed);
    local_204 = (uint)(zc->bmi2 != 0);
    local_170 = local_190 + -1;
    local_1c8 = &(CTable->entropy).fse;
    local_1d0 = (CTable->entropy).fse.litlengthCTable;
    pFVar15 = (CTable->entropy).fse.matchlengthCTable;
    bVar3 = true;
    nbSeq = 0;
    sourceSize = (FSE_CTable *)0x0;
    local_230 = count;
    local_220 = (FSE_CTable *)dst;
    local_1e8 = zc;
    local_1e0 = (byte *)src;
    local_1d8 = pFVar15;
    local_188 = sequences;
    local_180 = dst;
    do {
      pFVar27 = sourceSize;
      if (local_188 == local_190) {
LAB_00143aaa:
        if (local_178 < local_228) {
          __assert_fail("lp <= lend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4ed3,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        sourceSize = (FSE_CTable *)(local_178 + -(long)local_228);
        uVar12 = (undefined4)CONCAT71((int7)((ulong)pFVar15 >> 8),1);
        if (sourceSize < pFVar27) {
          __assert_fail("litSize <= (size_t)(lend - lp)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4ed4,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
      }
      else {
        psVar29 = sequences + nbSeq;
        uVar1 = psVar29->litLength;
        uVar24 = (uint)uVar1;
        if ((local_1e8->seqStore).longLengthPos ==
            (U32)((ulong)((long)psVar29 - (long)(local_1e8->seqStore).sequencesStart) >> 3)) {
          uVar24 = uVar1 + 0x10000;
          if ((local_1e8->seqStore).longLengthType != ZSTD_llt_literalLength) {
            uVar24 = (uint)uVar1;
          }
        }
        pFVar15 = (FSE_CTable *)(ulong)uVar24;
        sourceSize = (FSE_CTable *)((long)sourceSize + (long)pFVar15);
        nbSeq = nbSeq + 1;
        pFVar27 = sourceSize;
        if (psVar29 == local_170) goto LAB_00143aaa;
        uVar12 = 0;
      }
      local_240 = CONCAT44(local_240._4_4_,0xff);
      pFVar15 = (FSE_CTable *)(ulong)(entropyMetadata.hufMetadata.hType - set_compressed);
      pFVar27 = sourceSize;
      if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
        pFVar15 = sourceSize;
        sVar8 = HIST_count_wksp(count,(uint *)&local_240,local_228,(size_t)sourceSize,count,0x22d8);
        if (sVar8 < 0xffffffffffffff89) {
          if ((int)(uint)local_240 < 0) {
            lVar28 = 3;
          }
          else {
            pFVar15 = (FSE_CTable *)0x0;
            uVar17 = 0;
            do {
              uVar17 = uVar17 + (ulong)count[(long)pFVar15] *
                                (ulong)(byte)(CTable->entropy).huf.CTable[(long)((long)pFVar15 + 1)]
              ;
              pFVar15 = (FSE_CTable *)((long)pFVar15 + 1);
            } while ((FSE_CTable *)((local_240 & 0xffffffff) + 1) != pFVar15);
            lVar28 = (uVar17 >> 3) + 3;
          }
          sVar8 = entropyMetadata.hufMetadata.hufDesSize;
          if (local_268 == 0) {
            sVar8 = 0;
          }
          pFVar27 = (FSE_CTable *)(lVar28 + sVar8);
        }
      }
      else if (entropyMetadata.hufMetadata.hType != set_basic) {
        if (entropyMetadata.hufMetadata.hType != set_rle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4e3d,
                        "size_t ZSTD_estimateSubBlockSize_literal(const BYTE *, size_t, const ZSTD_hufCTables_t *, const ZSTD_hufCTablesMetadata_t *, void *, size_t, int)"
                       );
        }
        pFVar27 = (FSE_CTable *)0x1;
      }
      if (nbSeq == 0) {
        bVar25 = (byte)uVar12;
        lVar28 = 0;
        pbVar7 = (byte *)0x0;
        local_1a0 = sequences;
        if (local_198 < (byte *)((long)pFVar27 + 6) || bVar25 != 0) goto LAB_00143da0;
        nbSeq = 0;
      }
      else {
        sVar8 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.ofType,local_200,0x1f,nbSeq,
                           local_1c8->offcodeCTable,(U8 *)0x0,OF_defaultNorm,5,0x1c,count,
                           CONCAT44(uVar12,in_stack_fffffffffffffd88));
        sVar9 = ZSTD_estimateSubBlockSize_symbolType
                          (entropyMetadata.fseMetadata.llType,local_1f0,0x23,nbSeq,local_1d0,"",
                           LL_defaultNorm,6,0x23,count,CONCAT44(uVar12,in_stack_fffffffffffffd88));
        sVar10 = ZSTD_estimateSubBlockSize_symbolType
                           (entropyMetadata.fseMetadata.mlType,(BYTE *)local_1f8,0x34,nbSeq,
                            local_1d8,"",ML_defaultNorm,6,0x34,count,
                            CONCAT44(uVar12,in_stack_fffffffffffffd88));
        pFVar15 = (FSE_CTable *)0x0;
        if (bVar3) {
          pFVar15 = (FSE_CTable *)entropyMetadata.fseMetadata.fseTablesSize;
        }
        bVar25 = (byte)uVar12;
        count = local_230;
        if (local_198 < (byte *)((long)pFVar15 + (long)((long)pFVar27 + sVar8 + sVar9 + sVar10)) + 6
            || bVar25 != 0) {
          local_1a0 = sequences + nbSeq;
          if ((long)nbSeq < 1) {
            lVar28 = 0;
            pbVar7 = (byte *)0x0;
          }
          else {
            uVar17 = (long)sequences - (long)(local_1e8->seqStore).sequencesStart;
            lVar20 = nbSeq * 8;
            pUVar22 = &sequences->mlBase;
            lVar28 = 0;
            pbVar7 = (byte *)0x0;
            do {
              uVar1 = pUVar22[-1];
              uVar13 = (uint)uVar1;
              uVar24 = *pUVar22 + 3;
              if ((local_1e8->seqStore).longLengthPos == (U32)(uVar17 >> 3)) {
                ZVar2 = (local_1e8->seqStore).longLengthType;
                uVar13 = uVar1 + 0x10000;
                if (ZVar2 != ZSTD_llt_literalLength) {
                  uVar13 = (uint)uVar1;
                }
                if (ZVar2 == ZSTD_llt_matchLength) {
                  uVar24 = *pUVar22 + 0x10003;
                }
              }
              lVar28 = lVar28 + (ulong)uVar24;
              pbVar7 = pbVar7 + uVar13;
              uVar17 = uVar17 + 8;
              lVar20 = lVar20 + -8;
              pUVar22 = pUVar22 + 4;
            } while (0 < lVar20);
            if (sourceSize < pbVar7) {
              __assert_fail("litLengthSum <= litSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x4d89,
                            "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                           );
            }
          }
LAB_00143da0:
          bVar32 = (byte)uVar12;
          if ((FSE_CTable *)pbVar7 != sourceSize && bVar25 == 0) {
            __assert_fail("litLengthSum == litSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4d8b,
                          "size_t ZSTD_seqDecompressedSize(const seqStore_t *, const seqDef *, size_t, size_t, int)"
                         );
          }
          bVar31 = (int)local_1a8 != 0;
          dst_00 = (uint *)((long)local_220 + 3);
          sVar8 = (local_218 - (long)local_220) - 3;
          lVar20 = 0;
          if (local_268 != 0) {
            lVar20 = 200;
          }
          sVar26 = set_repeat;
          if (local_268 != 0) {
            sVar26 = entropyMetadata.hufMetadata.hType;
          }
          lVar20 = (ulong)((byte *)(0x4000 - lVar20) <= sourceSize) -
                   (ulong)(sourceSize < (byte *)(0x400 - lVar20));
          bVar25 = bVar32;
          if (sourceSize == (FSE_CTable *)0x0) {
            if (sVar8 == 0) {
              return (size_t)(byte *)0xffffffffffffffba;
            }
            *(byte *)dst_00 = 0;
            pbVar7 = (byte *)0x1;
LAB_00143f70:
            iVar6 = 0;
            bVar32 = bVar25;
          }
          else {
            if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
              pbVar7 = (byte *)((long)local_220 + lVar20 + 7);
              if (entropyMetadata.hufMetadata.hType == set_compressed && local_268 != 0) {
                memcpy(pbVar7,entropyMetadata.hufMetadata.hufDesBuffer,
                       entropyMetadata.hufMetadata.hufDesSize);
                local_210 = entropyMetadata.hufMetadata.hufDesSize;
                pbVar7 = pbVar7 + entropyMetadata.hufMetadata.hufDesSize;
                bVar25 = bVar32;
              }
              else {
                local_210 = 0;
              }
              uVar17 = lVar20 + 4;
              if (uVar17 == 3) {
                sVar9 = HUF_compress1X_usingCTable_internal
                                  (pbVar7,local_218 - (long)pbVar7,local_228,(size_t)sourceSize,
                                   (HUF_CElt *)CTable,local_204);
              }
              else {
                sVar9 = HUF_compress4X_usingCTable_internal
                                  (pbVar7,local_218 - (long)pbVar7,local_228,(size_t)sourceSize,
                                   (HUF_CElt *)CTable,local_204);
              }
              pFVar15 = (FSE_CTable *)(sVar9 - 1);
              count = local_230;
              if ((FSE_CTable *)0xffffffffffffff87 < pFVar15) goto LAB_0014435a;
              pbVar19 = (byte *)(local_210 + sVar9);
              if ((local_268 == 0) && (sourceSize <= pbVar19)) {
                pFVar15 = sourceSize;
                pbVar7 = (byte *)ZSTD_noCompressLiterals(dst_00,sVar8,local_228,(size_t)sourceSize);
                iVar6 = 0;
                bVar32 = bVar25;
              }
              else if (uVar17 < ((ulong)((byte *)0x3ff < pbVar19) -
                                (ulong)(pbVar19 < (byte *)0x4000)) + 4) {
                if (pbVar19 <= sourceSize) {
                  __assert_fail("cLitSize > litSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x4d56,
                                "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                               );
                }
                pFVar15 = sourceSize;
                pbVar7 = (byte *)ZSTD_noCompressLiterals(dst_00,sVar8,local_228,(size_t)sourceSize);
                iVar6 = 0;
                bVar32 = bVar25;
              }
              else {
                iVar6 = (int)sourceSize * 0x10;
                uVar24 = (uint)pbVar19;
                if (uVar17 == 5) {
                  uVar13 = uVar24 * 0x400000 + sVar26 + iVar6 + 0xc;
                  pFVar15 = (FSE_CTable *)(ulong)uVar13;
                  *(uint *)((long)local_220 + 3) = uVar13;
                  *(byte *)((long)local_220 + 7) = (byte)(uVar24 >> 10);
                }
                else if (uVar17 == 4) {
                  uVar24 = uVar24 * 0x40000 + sVar26 + iVar6 + 8;
                  *dst_00 = uVar24;
                  pFVar15 = (FSE_CTable *)(ulong)uVar24;
                }
                else {
                  iVar6 = uVar24 * 0x4000 + sVar26 + iVar6;
                  *(short *)((long)local_220 + 3) = (short)iVar6;
                  *(byte *)((long)local_220 + 5) = (byte)((uint)iVar6 >> 0x10);
                  pFVar15 = local_220;
                }
                pbVar7 = pbVar7 + (sVar9 - (long)dst_00);
                iVar6 = 1;
                bVar32 = bVar25;
              }
            }
            else {
              if (entropyMetadata.hufMetadata.hType == set_rle) {
                pbVar7 = (byte *)ZSTD_compressRleLiteralsBlock
                                           (dst_00,sVar8,local_228,(size_t)sourceSize);
                bVar25 = bVar32;
                goto LAB_00143f70;
              }
              if (entropyMetadata.hufMetadata.hType != set_basic) {
                __assert_fail("hufMetadata->hType == set_compressed || hufMetadata->hType == set_repeat"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x4d3d,
                              "size_t ZSTD_compressSubBlock_literal(const HUF_CElt *, const ZSTD_hufCTablesMetadata_t *, const BYTE *, size_t, void *, size_t, const int, int, int *)"
                             );
              }
              pFVar15 = sourceSize;
              pbVar7 = (byte *)ZSTD_noCompressLiterals(dst_00,sVar8,local_228,(size_t)sourceSize);
              iVar6 = 0;
            }
            if ((byte *)0xffffffffffffff88 < pbVar7) {
              return (size_t)pbVar7;
            }
            count = local_230;
            if (pbVar7 == (byte *)0x0) goto LAB_0014435a;
          }
          pbVar7 = (byte *)((long)dst_00 + (long)pbVar7);
          bVar30 = 0x39 < (local_1e8->appliedParams).cParams.windowLog;
          if (local_218 - (long)pbVar7 < 4) {
            return (size_t)(byte *)0xffffffffffffffba;
          }
          if (nbSeq < 0x7f) {
            *pbVar7 = (byte)nbSeq;
            if (nbSeq != 0) {
              pbVar19 = pbVar7 + 1;
              goto LAB_001440bf;
            }
            pbVar18 = (byte *)0x1;
            bVar30 = true;
LAB_00144284:
            pbVar19 = (byte *)((long)(pbVar7 + (long)pbVar18) - (long)local_220);
            uVar24 = (bVar31 & bVar25 | 0xffffffec) + (int)pbVar19 * 8;
            *(short *)local_220 = (short)uVar24;
            pFVar15 = (FSE_CTable *)(ulong)(uVar24 >> 0x10);
            *(byte *)((long)local_220 + 2) = (byte)(uVar24 >> 0x10);
            if ((byte *)0xffffffffffffff88 < pbVar19) {
              return (size_t)pbVar19;
            }
            count = local_230;
            if ((pbVar19 != (byte *)0x0) && (pbVar19 < (byte *)(lVar28 + (long)sourceSize))) {
              local_1e0 = local_1e0 + lVar28 + (long)sourceSize;
              if (local_1b8 < local_1e0) {
                __assert_fail("ip + decompressedSize <= iend",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x4eef,
                              "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                             );
              }
              local_228 = local_228 + (long)sourceSize;
              local_1f0 = local_1f0 + nbSeq;
              local_1f8 = (FSE_CTable *)((long)local_1f8 + nbSeq);
              local_200 = local_200 + nbSeq;
              pFVar15 = (FSE_CTable *)(ulong)local_268;
              if (iVar6 != 0) {
                pFVar15 = (FSE_CTable *)0x0;
              }
              local_268 = (uint)pFVar15;
              if (!bVar30) {
                bVar3 = false;
              }
              nbSeq = 0;
              sourceSize = (FSE_CTable *)0x0;
              sequences = local_1a0;
              local_220 = (FSE_CTable *)(pbVar7 + (long)pbVar18);
            }
          }
          else {
            if (nbSeq < 0x7f00) {
              *pbVar7 = (byte)(nbSeq >> 8) | 0x80;
              pbVar7[1] = (byte)nbSeq;
              pbVar19 = pbVar7 + 2;
            }
            else {
              *pbVar7 = 0xff;
              *(short *)(pbVar7 + 1) = (short)nbSeq + -0x7f00;
              pbVar19 = pbVar7 + 3;
            }
LAB_001440bf:
            pbVar18 = pbVar19 + 1;
            bVar25 = bVar32;
            if (bVar3) {
              local_210 = CONCAT44(local_210._4_4_,iVar6);
              *pbVar19 = (char)(entropyMetadata.fseMetadata.ofType << 4) +
                         (char)(entropyMetadata.fseMetadata.llType << 6) +
                         (char)entropyMetadata.fseMetadata.mlType * '\x04';
              memcpy(pbVar18,entropyMetadata.fseMetadata.fseTablesBuffer,
                     entropyMetadata.fseMetadata.fseTablesSize);
              pbVar18 = pbVar18 + entropyMetadata.fseMetadata.fseTablesSize;
              pbVar11 = (byte *)ZSTD_encodeSequences
                                          (pbVar18,local_218 - (long)pbVar18,local_1d8,
                                           (BYTE *)local_1f8,local_1c8->offcodeCTable,local_200,
                                           local_1d0,local_1f0,sequences,nbSeq,(uint)bVar30,
                                           (int)local_1b0);
              if ((byte *)0xffffffffffffff88 < pbVar11) {
                return (size_t)pbVar11;
              }
              pbVar18 = pbVar18 + (long)pbVar11;
              iVar6 = (int)local_210;
              if (entropyMetadata.fseMetadata.lastCountSize == 0) {
                pFVar15 = (FSE_CTable *)0x0;
              }
              else {
                pFVar15 = (FSE_CTable *)(pbVar11 + entropyMetadata.fseMetadata.lastCountSize);
                if (pFVar15 < (FSE_CTable *)0x4) {
                  count = local_230;
                  if (pFVar15 != (FSE_CTable *)0x3) {
                    __assert_fail("fseMetadata->lastCountSize + bitstreamSize == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x4ddf,
                                  "size_t ZSTD_compressSubBlock_sequences(const ZSTD_fseCTables_t *, const ZSTD_fseCTablesMetadata_t *, const seqDef *, size_t, const BYTE *, const BYTE *, const BYTE *, const ZSTD_CCtx_params *, void *, size_t, const int, int, int *)"
                                 );
                  }
                  goto LAB_0014435a;
                }
              }
            }
            else {
              *pbVar19 = 0xfc;
              pFVar15 = local_1f8;
              pbVar11 = (byte *)ZSTD_encodeSequences
                                          (pbVar18,local_218 - (long)pbVar18,local_1d8,
                                           (BYTE *)local_1f8,local_1c8->offcodeCTable,local_200,
                                           local_1d0,local_1f0,sequences,nbSeq,(uint)bVar30,
                                           (int)local_1b0);
              if ((byte *)0xffffffffffffff88 < pbVar11) {
                return (size_t)pbVar11;
              }
              pbVar18 = pbVar18 + (long)pbVar11;
            }
            count = local_230;
            if (3 < (long)pbVar18 - (long)pbVar19) {
              pbVar18 = pbVar18 + -(long)pbVar7;
              if ((byte *)0xffffffffffffff88 < pbVar18) {
                return (size_t)pbVar18;
              }
              if (pbVar18 != (byte *)0x0) {
                bVar30 = false;
                goto LAB_00144284;
              }
            }
          }
        }
      }
LAB_0014435a:
    } while (bVar25 == 0);
    if (local_268 != 0) {
      memcpy(CTable,local_1c0,0x810);
    }
    pFVar15 = local_220;
    if ((bVar3) &&
       (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
         (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
        (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
      pbVar7 = (byte *)0x0;
    }
    else {
      if (local_1e0 < local_1b8) {
        __n = (long)local_1b8 - (long)local_1e0;
        pbVar7 = (byte *)(__n + 3);
        if ((byte *)(local_218 - (long)local_220) < pbVar7) {
          return (size_t)(byte *)0xffffffffffffffba;
        }
        iVar6 = (int)local_1a8 + (int)__n * 8;
        *(short *)local_220 = (short)iVar6;
        *(byte *)((long)local_220 + 2) = (byte)((uint)iVar6 >> 0x10);
        memcpy((byte *)((long)local_220 + 3),local_1e0,__n);
        if ((byte *)0xffffffffffffff88 < pbVar7) {
          return (size_t)pbVar7;
        }
        if (pbVar7 == (byte *)0x0) {
          __assert_fail("cSize != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x4f12,
                        "size_t ZSTD_compressSubBlock_multi(const seqStore_t *, const ZSTD_compressedBlockState_t *, ZSTD_compressedBlockState_t *, const ZSTD_entropyCTablesMetadata_t *, const ZSTD_CCtx_params *, void *, size_t, const void *, size_t, const int, U32, void *, size_t)"
                       );
        }
        pFVar15 = (FSE_CTable *)((long)pFVar15 + (long)pbVar7);
        if (sequences < local_190) {
          UVar21 = local_1c0->rep[2];
          local_238 = UVar21;
          local_240 = *(ulong *)local_1c0->rep;
          uVar4 = local_240;
          if (local_188 < sequences) {
            local_240._4_4_ = (U32)(local_240 >> 0x20);
            uVar17 = (long)local_188 - (long)(local_1e8->seqStore).sequencesStart;
            psVar29 = local_188;
            UVar14 = (uint)local_240;
            UVar16 = local_240._4_4_;
            local_240 = uVar4;
            do {
              uVar1 = psVar29->litLength;
              uVar24 = (uint)uVar1;
              if (((local_1e8->seqStore).longLengthPos == (U32)(uVar17 >> 3)) &&
                 (uVar24 = uVar1 + 0x10000,
                 (local_1e8->seqStore).longLengthType != ZSTD_llt_literalLength)) {
                uVar24 = (uint)uVar1;
              }
              uVar13 = psVar29->offBase;
              if (uVar13 < 4) {
                if (uVar13 == 0) {
                  __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x46c3,"void ZSTD_updateRep(U32 *, const U32, const U32)");
                }
                uVar24 = (uVar13 + (uVar24 == 0)) - 1;
                UVar23 = UVar14;
                UVar5 = UVar16;
                if (uVar24 != 0) {
                  if (uVar24 == 3) {
                    UVar23 = UVar14 - 1;
                  }
                  else {
                    UVar23 = *(U32 *)((long)&local_240 + (ulong)uVar24 * 4);
                  }
                  if (uVar24 == 1) {
                    UVar16 = UVar21;
                  }
                  local_238 = UVar16;
                  goto LAB_00144519;
                }
              }
              else {
                local_238 = UVar16;
                UVar23 = uVar13 - 3;
LAB_00144519:
                local_240 = CONCAT44(UVar14,UVar23);
                UVar5 = UVar14;
                UVar21 = UVar16;
                local_238 = UVar16;
              }
              UVar16 = UVar5;
              UVar14 = UVar23;
              psVar29 = psVar29 + 1;
              uVar17 = uVar17 + 8;
            } while (psVar29 < sequences);
          }
          CTable->rep[2] = local_238;
          *(ulong *)CTable->rep = local_240;
        }
      }
      pbVar7 = (byte *)((long)pFVar15 - (long)local_180);
    }
  }
  return (size_t)pbVar7;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               void const* src, size_t srcSize,
                               unsigned lastBlock) {
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}